

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

int4 __thiscall
ParamListStandard::characterizeAsParam(ParamListStandard *this,Address *loc,int4 size)

{
  pointer pprVar1;
  rangemap<ParamEntryRange> *this_00;
  ParamEntry *this_01;
  AddrSpace *pAVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  int4 iVar6;
  ulong uVar7;
  long lVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  int4 iVar11;
  pair<rangemap<ParamEntryRange>::PartIterator,_rangemap<ParamEntryRange>::PartIterator> pVar12;
  
  uVar7 = (ulong)loc->base->index;
  pprVar1 = (this->resolverMap).
            super__Vector_base<rangemap<ParamEntryRange>_*,_std::allocator<rangemap<ParamEntryRange>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->resolverMap).
                    super__Vector_base<rangemap<ParamEntryRange>_*,_std::allocator<rangemap<ParamEntryRange>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pprVar1 >> 3) <= uVar7) {
    return 0;
  }
  this_00 = pprVar1[uVar7];
  if (this_00 == (rangemap<ParamEntryRange> *)0x0) {
    return 0;
  }
  pVar12 = rangemap<ParamEntryRange>::find(this_00,loc->offset);
  cVar9._M_node = (_Base_ptr)pVar12.first.iter._M_node;
  lVar8 = (long)size;
  iVar11 = 0;
  while ((const_iterator)cVar9._M_node != pVar12.second.iter._M_node.iter) {
    this_01 = (ParamEntry *)cVar9._M_node[2]._M_parent[1]._M_parent;
    if ((size < this_01->minsize) ||
       (iVar6 = ParamEntry::justifiedContain(this_01,loc,size), iVar6 != 0)) {
      if (this_01->spaceid == loc->base) {
        if ((loc->offset <= this_01->addressbase) &&
           ((this_01->addressbase + (long)this_01->size) - 1 <= loc->offset + lVar8 + -1)) {
          iVar11 = 2;
        }
      }
      cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar9._M_node);
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
    if (!bVar5) {
      return 1;
    }
  }
  if (iVar11 == 2) {
    return 2;
  }
  if ((_Rb_tree_header *)cVar9._M_node != &(this_00->tree)._M_t._M_impl.super__Rb_tree_header) {
    cVar10 = rangemap<ParamEntryRange>::find_end(this_00,(lVar8 + loc->offset) - 1);
    pAVar2 = loc->base;
    p_Var3 = (_Base_ptr)loc->offset;
    do {
      if ((const_iterator)cVar9._M_node == cVar10.iter._M_node) {
        return iVar11;
      }
      p_Var4 = cVar9._M_node[2]._M_parent[1]._M_parent;
      if ((((AddrSpace *)p_Var4->_M_left == pAVar2) && (p_Var3 <= p_Var4->_M_right)) &&
         ((ulong)((long)p_Var4->_M_right + (long)(int)p_Var4[1]._M_color + -1) <=
          (ulong)((long)p_Var3 + lVar8 + -1))) {
        iVar11 = 2;
        bVar5 = false;
      }
      else {
        cVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar9._M_node);
        bVar5 = true;
      }
    } while (bVar5);
    return iVar11;
  }
  return iVar11;
}

Assistant:

int4 ParamListStandard::characterizeAsParam(const Address &loc,int4 size) const

{
  int4 index = loc.getSpace()->getIndex();
  if (index >= resolverMap.size())
    return 0;
  ParamEntryResolver *resolver = resolverMap[index];
  if (resolver == (ParamEntryResolver *)0)
    return 0;
  pair<ParamEntryResolver::const_iterator,ParamEntryResolver::const_iterator> iterpair;
  iterpair = resolver->find(loc.getOffset());
  int4 res = 0;
  while(iterpair.first != iterpair.second) {
    const ParamEntry *testEntry = (*iterpair.first).getParamEntry();
    if (testEntry->getMinSize() <= size && testEntry->justifiedContain(loc, size)==0)
      return 1;
    if (testEntry->containedBy(loc, size))
      res = 2;
    ++iterpair.first;
  }
  if (res != 2 && iterpair.first != resolver->end()) {
    iterpair.second = resolver->find_end(loc.getOffset() + (size-1));
    while(iterpair.first != iterpair.second) {
      const ParamEntry *testEntry = (*iterpair.first).getParamEntry();
      if (testEntry->containedBy(loc, size)) {
	res = 2;
	break;
      }
      ++iterpair.first;
    }
  }
  return res;
}